

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O1

void RigidBodyDynamics::CalcContactSystemVariables
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS)

{
  ConstraintSet *QDDot;
  double *pdVar1;
  pointer pSVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  SpatialTransform *pSVar8;
  pointer pSVar9;
  ActualDstType actualDst;
  bool bVar10;
  byte bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  SpatialTransform local_98;
  
  bVar11 = 0;
  NonlinearEffects(model,Q,QDot,(VectorNd *)(CS + 0xc0));
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)(CS + 0xa8),false);
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar4 = 1;
    uVar7 = 2;
    do {
      Math::SpatialTransform::operator*
                (&local_98,
                 (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4,
                 (model->X_base).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4]);
      pSVar2 = (model->X_base).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar8 = &local_98;
      pSVar9 = pSVar2 + uVar4;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(double *)&(pSVar9->E).super_Matrix3d =
             (pSVar8->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[0];
        pSVar8 = (SpatialTransform *)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
        pSVar9 = (pointer)((long)pSVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      }
      *(double *)((long)&pSVar2[uVar4].r.super_Vector3d + 0x10) =
           local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
      *(double *)
       &pSVar2[uVar4].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
           = local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
      *(double *)
       ((long)&pSVar2[uVar4].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
           local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
      uVar4 = ((long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(model->mBodies).
                     super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      bVar10 = uVar7 <= uVar4;
      lVar3 = uVar4 - uVar7;
      uVar4 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar10 && lVar3 != 0);
  }
  CalcContactJacobian(model,Q,CS,(MatrixNd *)(CS + 0xe0),false);
  QDDot = CS + 0x210;
  if (0 < *(long *)(CS + 0x218)) {
    memset(*(void **)QDDot,0,*(long *)(CS + 0x218) << 3);
  }
  UpdateKinematicsCustom(model,(VectorNd *)0x0,(VectorNd *)0x0,(VectorNd *)QDDot);
  iVar5 = 0;
  if (*(long *)(CS + 0x70) != 0) {
    dVar12 = 0.0;
    dVar13 = 0.0;
    dVar14 = 0.0;
    uVar6 = 1;
    dVar15 = 0.0;
    dVar16 = 0.0;
    dVar17 = 0.0;
    uVar4 = 0;
    do {
      if (iVar5 == *(int *)(*(long *)(CS + 0x20) + uVar4 * 4)) {
        pdVar1 = (double *)(*(long *)(CS + 0x38) + uVar4 * 0x18);
        if ((dVar13 != *pdVar1) || (NAN(dVar13) || NAN(*pdVar1))) goto LAB_00111322;
        lVar3 = *(long *)(CS + 0x38) + uVar4 * 0x18;
        pdVar1 = (double *)(lVar3 + 8);
        if ((dVar14 != *pdVar1) || (NAN(dVar14) || NAN(*pdVar1))) goto LAB_00111322;
        pdVar1 = (double *)(lVar3 + 0x10);
        if ((dVar17 != *pdVar1) || (NAN(dVar17) || NAN(*pdVar1))) goto LAB_00111322;
      }
      else {
LAB_00111322:
        lVar3 = uVar4 * 0x18;
        CalcPointAcceleration
                  ((Vector3d *)&local_98,model,Q,QDot,(VectorNd *)QDDot,
                   *(uint *)(*(long *)(CS + 0x20) + uVar4 * 4),
                   (Vector3d *)(*(long *)(CS + 0x38) + lVar3),false);
        iVar5 = *(int *)(*(long *)(CS + 0x20) + uVar4 * 4);
        pdVar1 = (double *)(*(long *)(CS + 0x38) + lVar3);
        dVar13 = *pdVar1;
        dVar14 = pdVar1[1];
        dVar17 = *(double *)(*(long *)(CS + 0x38) + 0x10 + lVar3);
        dVar12 = local_98.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [2];
        dVar15 = local_98.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [0];
        dVar16 = local_98.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1];
      }
      pdVar1 = (double *)(*(long *)(CS + 0x50) + uVar4 * 0x18);
      *(double *)(*(long *)(CS + 0xd0) + uVar4 * 8) =
           *(double *)(*(long *)(CS + 0x68) + uVar4 * 8) -
           (*(double *)(*(long *)(CS + 0x50) + 0x10 + uVar4 * 0x18) * dVar12 +
           pdVar1[1] * dVar16 + *pdVar1 * dVar15);
      uVar4 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar4 < *(ulong *)(CS + 0x70));
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcContactSystemVariables (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDot,
		const Math::VectorNd &Tau,
		ConstraintSet &CS
		) {
	// Compute C
	NonlinearEffects (model, Q, QDot, CS.C);
	assert (CS.H.cols() == model.dof_count && CS.H.rows() == model.dof_count);

	// Compute H
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	// We have to update model.X_base as they are not automatically computed
	// by NonlinearEffects()
	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		model.X_base[i] = model.X_lambda[i] * model.X_base[model.lambda[i]];
	}
	CalcContactJacobian (model, Q, CS, CS.G, false);

	// Compute gamma
	unsigned int prev_body_id = 0;
	Vector3d prev_body_point = Vector3d::Zero();
	Vector3d gamma_i = Vector3d::Zero();

	CS.QDDot_0.setZero();
	UpdateKinematicsCustom (model, NULL, NULL, &CS.QDDot_0);

	for (unsigned int i = 0; i < CS.size(); i++) {
		// only compute point accelerations when necessary
		if (prev_body_id != CS.body[i] || prev_body_point != CS.point[i]) {
			gamma_i = CalcPointAcceleration (model, Q, QDot, CS.QDDot_0, CS.body[i], CS.point[i], false);
			prev_body_id = CS.body[i];
			prev_body_point = CS.point[i];
		}

		// we also substract ContactData[i].acceleration such that the contact
		// point will have the desired acceleration
		CS.gamma[i] = CS.acceleration[i] - CS.normal[i].dot(gamma_i);
	}
}